

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O3

vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
* __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::pathTo
          (vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
           *__return_storage_ptr__,WeightedDigraphSPDijkstra<int,_int> *this,int vertex)

{
  int iVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar2;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  out_of_range *poVar4;
  const_iterator __position;
  value_type local_38;
  
  pLVar2 = (this->_weight_to)._list._header;
  do {
    pLVar2 = pLVar2->_next;
    if (pLVar2 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar4,"No path!");
      __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  } while ((pLVar2->element).key != vertex);
  (__return_storage_ptr__->
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar3 = (this->_edge_to)._list._header;
  do {
    pLVar3 = pLVar3->_next;
    if (pLVar3 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar4,"Key error, no such key in this table !");
      __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  } while ((pLVar3->element).key != vertex);
  local_38.from = (pLVar3->element).value.from;
  local_38.to = (pLVar3->element).value.to;
  local_38.weight = (pLVar3->element).value.weight;
  __position._M_current =
       (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
        *)0x0;
  do {
    std::
    vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
    ::insert(__return_storage_ptr__,__position,&local_38);
    iVar1 = ((local_38.from)->element).key;
    if (iVar1 == this->_start) {
      return __return_storage_ptr__;
    }
    pLVar3 = (this->_edge_to)._list._header;
    do {
      pLVar3 = pLVar3->_next;
      if (pLVar3 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(poVar4,"Key error, no such key in this table !");
        __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
    } while ((pLVar3->element).key != iVar1);
    local_38.weight = (pLVar3->element).value.weight;
    local_38.from = (pLVar3->element).value.from;
    local_38.to = (pLVar3->element).value.to;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

std::vector<Edge>pathTo(T vertex) {
            if (!hasPathTo(vertex)) {
                throw std::out_of_range("No path!");
            }
            std::vector<Edge> path;
            auto edge = _edge_to.get(vertex);
            while (true) {
                path.insert(path.begin(), edge);
                if (edge.from->element.key == _start) {
                    break;
                }
                edge = _edge_to.get(edge.from->element.key);
            }
            return path;
        }